

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O2

string * Capitalize(string *__return_storage_ptr__,string str)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  char cVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI->_M_string_length != 0) {
    pcVar3 = (in_RSI->_M_dataplus)._M_p;
    cVar1 = *pcVar3;
    cVar4 = cVar1 + -0x20;
    if (0x19 < (byte)(cVar1 + 0x9fU)) {
      cVar4 = cVar1;
    }
    *pcVar3 = cVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,in_RSI);
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string Capitalize(std::string str)
{
    if (str.empty()) return str;
    str[0] = ToUpper(str.front());
    return str;
}